

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O2

void vault_monsters(chunk_conflict *c,loc_conflict grid,wchar_t depth,wchar_t num)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  int iVar4;
  bool bVar5;
  loc_conflict near;
  
  _Var1 = square_in_bounds(c,(loc)grid);
  if (_Var1) {
    wVar3 = L'\0';
    if (num < L'\x01') {
      num = L'\0';
    }
    for (; wVar3 != num; wVar3 = wVar3 + L'\x01') {
      iVar4 = 9;
      do {
        bVar5 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        if (bVar5) goto LAB_00155dc0;
        wVar2 = scatter_ext(c,(loc *)&near,L'\x01',(loc)grid,L'\x01',true,square_isempty);
      } while (wVar2 == L'\0');
      pick_and_place_monster((chunk *)c,(loc)near,depth,true,true,'\v');
LAB_00155dc0:
    }
  }
  return;
}

Assistant:

void vault_monsters(struct chunk *c, struct loc grid, int depth, int num)
{
	int k, i;

	/* If the starting location is illegal, don't even start */
	if (!square_in_bounds(c, grid)) return;

	/* Try to summon "num" monsters "near" the given location */
	for (k = 0; k < num; k++) {
		/* Try nine locations */
		for (i = 0; i < 9; i++) {
			struct loc near;

			/* Pick a nearby empty location. */
			if (scatter_ext(c, &near, 1, grid, 1, true,
					square_isempty) == 0) continue;

			/* Place the monster (allow groups) */
			pick_and_place_monster(c, near, depth, true, true,
				ORIGIN_DROP_SPECIAL);

			break;
		}
	}
}